

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canfdtest.c
# Opt level: O2

void print_frame(canid_t id,uint8_t *data,int dlc,int inc_data)

{
  ulong uVar1;
  
  printf("%04x: ",id);
  if ((id >> 0x1e & 1) == 0) {
    printf("[%d]",(ulong)(uint)dlc);
    if (dlc < 1) {
      dlc = 0;
    }
    for (uVar1 = 0; (uint)dlc != uVar1; uVar1 = uVar1 + 1) {
      printf(" %02x",(ulong)(byte)(data[uVar1] + (char)inc_data));
    }
  }
  else {
    printf("remote request");
  }
  putchar(10);
  return;
}

Assistant:

static void print_frame(canid_t id, const uint8_t *data, int dlc, int inc_data)
{
	int i;

	printf("%04x: ", id);
	if (id & CAN_RTR_FLAG) {
		printf("remote request");
	} else {
		printf("[%d]", dlc);
		for (i = 0; i < dlc; i++)
			printf(" %02x", (uint8_t)(data[i] + inc_data));
	}
	printf("\n");
}